

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_cdata_call(jit_State *J,RecordFFData *rd)

{
  CTSize *pCVar1;
  TRef *pTVar2;
  CType *d;
  byte bVar3;
  CTState *cts;
  CTState *cts_00;
  CType *pCVar4;
  lua_State *plVar5;
  TValue *pTVar6;
  BCIns *pBVar7;
  TValue *pTVar8;
  BCIns *pBVar9;
  TRef *pTVar10;
  CTypeID id;
  TRef TVar11;
  CTypeID id_00;
  IRType IVar12;
  uint uVar13;
  uint uVar14;
  TRef TVar15;
  GCcdata *cd;
  uint64_t uVar16;
  cTValue *pcVar17;
  IRRef1 IVar18;
  ushort uVar19;
  MMS mm;
  short sVar20;
  lua_State *L;
  uint uVar21;
  ulong uVar22;
  TValue *base;
  ulong uVar23;
  bool bVar24;
  CType *local_100;
  IRRef1 local_f4;
  cTValue local_c0;
  TRef local_b8;
  TRef local_b4 [33];
  
  cts = *(CTState **)&J[-1].penalty[0x3c].val;
  cd = argv2cdata(J,*J->base,rd->argv);
  uVar19 = cd->ctypeid;
  if (uVar19 == 0x16) {
    id_00 = crec_constructor(J,cd,*J->base);
    mm = MM_new;
LAB_00135d5c:
    uVar13 = cts->tab[id_00].info;
    id = uVar13 & 0xffff;
    if ((uVar13 & 0xf0000000) != 0x20000000) {
      id = id_00;
    }
    pcVar17 = lj_ctype_meta(cts,id,mm);
    if (pcVar17 == (cTValue *)0x0) {
      if (uVar19 == 0x16) {
        crec_alloc(J,rd,id_00);
        return;
      }
    }
    else if ((pcVar17->field_4).it >> 0xf == 0x1fff7) {
      TVar15 = lj_ir_kgc(J,(GCobj *)((ulong)pcVar17->field_4 & 0x7fffffffffff),IRT_FUNC);
      pTVar10 = J->base;
      pTVar10[-2] = TVar15;
      pTVar10[-1] = 0x10000;
      rd->nres = -1;
      return;
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
  cts_00 = *(CTState **)&J[-1].penalty[0x3c].val;
  pCVar4 = cts_00->tab;
  local_100 = pCVar4 + uVar19;
  if ((pCVar4[uVar19].info & 0xf0000000) == 0x20000000) {
    pCVar1 = &local_100->size;
    local_100 = pCVar4 + (ushort)local_100->info;
    sVar20 = (ushort)(*pCVar1 == 8) * 4 + 5;
  }
  else {
    sVar20 = 9;
  }
  mm = MM_call;
  if ((local_100->info & 0xf0000000) != 0x60000000) {
    id_00 = (CTypeID)uVar19;
    goto LAB_00135d5c;
  }
  TVar15 = *J->base;
  (J->fold).ins.field_0.ot = sVar20 + 0x4500;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
  (J->fold).ins.field_0.op2 = 0x17;
  TVar15 = lj_opt_fold(J);
  local_f4 = (IRRef1)TVar15;
  pCVar4 = cts_00->tab + (ushort)local_100->info;
  IVar12 = crec_ct2irt(cts_00,pCVar4);
  if (sVar20 == 9) {
    uVar16 = cd[1].nextgc.gcptr64;
  }
  else {
    uVar16 = (uint64_t)(uint)cd[1].nextgc.gcptr64;
  }
  local_c0.u64 = uVar16 >> 2;
  pcVar17 = lj_tab_get(J->L,cts_00->miscmap,&local_c0);
  if ((pcVar17->field_4).it >> 0xf == 0x1fffd) {
    lj_trace_err(J,LJ_TRERR_BLACKL);
  }
  uVar13 = pCVar4->info >> 0x1c;
  if (uVar13 == 4) {
    rd->nres = 0;
    IVar12 = IRT_NIL;
  }
  else if (((uVar13 != 2 && 0xfffffff < pCVar4->info) && (uVar13 != 5)) || (IVar12 == IRT_CDATA))
  goto LAB_00135e83;
  if ((local_100->info & 0x800000) != 0) {
    TVar15 = lj_ir_kint(J,(int)((ulong)((long)local_100 - (long)cts_00->tab) >> 3) * -0x55555555);
    (J->fold).ins.field_0.ot = 0x6400;
    (J->fold).ins.field_0.op1 = local_f4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
    TVar15 = lj_opt_fold(J);
    local_f4 = (IRRef1)TVar15;
  }
  uVar19 = (ushort)IVar12;
  uVar13 = (uint)local_100->sib;
  uVar22 = 0;
  if (uVar13 == 0) {
    uVar13 = 0;
  }
  local_b8 = 0x7fff;
  if (J->base[1] != 0) {
    pcVar17 = rd->argv;
    uVar22 = 0;
    pTVar10 = J->base;
    do {
      if (uVar22 == 0x20) goto LAB_00135e83;
      pcVar17 = pcVar17 + 1;
      if (uVar13 == 0) {
        if ((local_100->info & 0x800000) == 0) goto LAB_00135e83;
        uVar14 = lj_ccall_ctid_vararg(cts_00,pcVar17);
        uVar13 = 0;
      }
      else {
        uVar14 = (uint)(ushort)cts_00->tab[uVar13].info;
        uVar13 = (uint)cts_00->tab[uVar13].sib;
      }
      uVar21 = cts_00->tab[uVar14].info;
      if (((0xfffffff < uVar21) && (uVar21 = uVar21 >> 0x1c, uVar21 != 2)) && (uVar21 != 5))
      goto LAB_00135e83;
      d = cts_00->tab + uVar14;
      TVar15 = crec_ct_tv(J,d,0,pTVar10[1],pcVar17);
      uVar14 = d->info;
      if (((uVar14 & 0xf4000000) == 0) && (d->size < 4)) {
        bVar24 = d->size != 1;
        (J->fold).ins.field_0.ot = 0x5b13;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
        IVar18 = bVar24 + 0x270 + (ushort)bVar24;
        if ((uVar14 >> 0x17 & 1) == 0) {
          IVar18 = bVar24 + 0xa6f + (ushort)bVar24;
        }
        (J->fold).ins.field_0.op2 = IVar18;
        TVar15 = lj_opt_fold(J);
      }
      local_b4[uVar22 - 1] = TVar15;
      uVar22 = uVar22 + 1;
      pTVar2 = pTVar10 + 2;
      pTVar10 = pTVar10 + 1;
    } while (*pTVar2 != 0);
  }
  IVar18 = (IRRef1)local_b8;
  if (1 < (uint)uVar22) {
    uVar23 = 1;
    TVar15 = local_b8;
    do {
      TVar11 = local_b4[uVar23 - 1];
      (J->fold).ins.field_0.ot = 0x6400;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
      TVar15 = lj_opt_fold(J);
      IVar18 = (IRRef1)TVar15;
      uVar23 = uVar23 + 1;
    } while ((uVar22 & 0xffffffff) != uVar23);
  }
  (J->fold).ins.field_0.ot = uVar19 | 0x6300;
  (J->fold).ins.field_0.op1 = IVar18;
  (J->fold).ins.field_0.op2 = local_f4;
  TVar15 = lj_opt_fold(J);
  IVar18 = (IRRef1)TVar15;
  if ((pCVar4->info & 0xf8000000) == 0x8000000) {
    plVar5 = J->L;
    pTVar6 = plVar5->base;
    pBVar7 = (BCIns *)pTVar6[-1].u64;
    if ((((ulong)pBVar7 & 3) != 0) || (TVar15 = 0x7fff, *(char *)((long)pBVar7 - 1) != '\x01')) {
      if ((((ulong)pBVar7 & 3) != 0) || (J->framedepth < 1)) {
LAB_00135e83:
        lj_trace_err(J,LJ_TRERR_NYICALL);
      }
      pTVar8 = plVar5->top;
      pBVar9 = J->pc;
      pTVar10 = J->base;
      TVar15 = pTVar10[-2];
      J->pc = pBVar7;
      bVar3 = *(byte *)((long)pBVar7 - 3);
      plVar5->top = pTVar6;
      plVar5->base = (TValue *)((long)pTVar6 - (ulong)((uint)bVar3 * 8 + 0x10));
      pTVar10[-2] = 0x1007ffe;
      uVar22 = (ulong)((uint)bVar3 * 4 + 8);
      J->base = (TRef *)((long)pTVar10 - uVar22);
      J->baseslot = J->baseslot - (bVar3 + 2);
      J->maxslot = bVar3 + 1;
      J->framedepth = J->framedepth + -1;
      lj_snap_add(J);
      plVar5->base = pTVar6;
      plVar5->top = pTVar8;
      J->framedepth = J->framedepth + 1;
      J->maxslot = 1;
      pTVar10 = J->base;
      J->base = (TRef *)((long)pTVar10 + uVar22);
      J->baseslot = J->baseslot + bVar3 + 2;
      *(TRef *)((long)pTVar10 + (uVar22 - 8)) = TVar15;
      J->pc = pBVar9;
      TVar15 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x990;
      (J->fold).ins.field_0.op1 = IVar18;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
      J->postproc = LJ_POST_FIXGUARDSNAP;
      TVar15 = 0x2007ffd;
    }
    goto LAB_00135d31;
  }
  if (((IVar12 < IRT_SOFTFP) && ((0x600220U >> (IVar12 & IRT_TYPE) & 1) != 0)) ||
     ((pCVar4->info & 0xf0000000) == 0x50000000)) {
    TVar15 = lj_ir_kint(J,(uint)(ushort)local_100->info);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
    (J->fold).ins.field_0.op2 = IVar18;
  }
  else {
    switch(IVar12) {
    case IRT_FLOAT:
    case IRT_U32:
      uVar19 = uVar19 | 0x1c0;
      (J->fold).ins.field_0.ot = 0x5b0e;
      goto LAB_00135e51;
    default:
      if ((IVar12 & ~IRT_TRUE) != IRT_U8) goto LAB_00135d31;
      uVar19 = uVar19 | 0x260;
      break;
    case IRT_I8:
    case IRT_I16:
      uVar19 = uVar19 | 0xa60;
    }
    (J->fold).ins.field_0.ot = 0x5b13;
LAB_00135e51:
    (J->fold).ins.field_0.op1 = IVar18;
    (J->fold).ins.field_0.op2 = uVar19;
  }
  TVar15 = lj_opt_fold(J);
LAB_00135d31:
  *J->base = TVar15;
  J->needsnap = '\x01';
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_call(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  GCcdata *cd = argv2cdata(J, J->base[0], &rd->argv[0]);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (id == CTID_CTYPEID) {
    id = crec_constructor(J, cd, J->base[0]);
    mm = MM_new;
  } else if (crec_call(J, rd, cd)) {
    return;
  }
  /* Record ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  tv = lj_ctype_meta(cts, ctype_isptr(ct->info) ? ctype_cid(ct->info) : id, mm);
  if (tv) {
    if (tvisfunc(tv)) {
      crec_tailcall(J, rd, tv);
      return;
    }
  } else if (mm == MM_new) {
    crec_alloc(J, rd, id);
    return;
  }
  /* No metamethod or NYI: non-function metamethods. */
  lj_trace_err(J, LJ_TRERR_BADTYPE);
}